

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

uint32_t DivideTest<unsigned_int>::randomSeed(void)

{
  result_type rVar1;
  uniform_int_distribution<unsigned_int> randDist;
  mt19937 randGen;
  random_device randomDevice;
  uint in_stack_ffffffffffffd8c8;
  uint in_stack_ffffffffffffd8cc;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  random_device *in_stack_ffffffffffffd910;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1388;
  
  this = &local_1388;
  std::random_device::random_device(in_stack_ffffffffffffd910);
  std::random_device::operator()((random_device *)0x11a3f3);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this,CONCAT44(in_stack_ffffffffffffd8cc,in_stack_ffffffffffffd8c8));
  std::numeric_limits<unsigned_int>::max();
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)this,in_stack_ffffffffffffd8cc,
             in_stack_ffffffffffffd8c8);
  rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                    ((uniform_int_distribution<unsigned_int> *)this,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)CONCAT44(in_stack_ffffffffffffd8cc,in_stack_ffffffffffffd8c8));
  std::random_device::~random_device((random_device *)0x11a447);
  return rVar1;
}

Assistant:

static uint32_t randomSeed() {
#if defined(__AVR__)
        return (uint32_t)analogRead(A0);
#else
        std::random_device randomDevice;
        std::mt19937 randGen(randomDevice());
        std::uniform_int_distribution<uint32_t> randDist(1, std::numeric_limits<uint32_t>::max());
        return randDist(randGen);
#endif
    }